

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O3

void __thiscall
argvParser::argvParser
          (argvParser *this,string *applicationNam_,string *description_,bool addDefaultHelpCommand_
          ,string *commentToken_)

{
  pointer pcVar1;
  char *pcVar2;
  vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
  *this_00;
  section *psVar3;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *pvVar4;
  size_type __dnew;
  section *local_50 [4];
  
  (this->super_argParserAdvancedConfiguration).helpMessage._M_dataplus._M_p =
       (pointer)&(this->super_argParserAdvancedConfiguration).helpMessage.field_2;
  (this->super_argParserAdvancedConfiguration).helpMessage._M_string_length = 0;
  (this->super_argParserAdvancedConfiguration).helpMessage.field_2._M_local_buf[0] = '\0';
  (this->super_argParserAdvancedConfiguration).applicationName._M_dataplus._M_p =
       (pointer)&(this->super_argParserAdvancedConfiguration).applicationName.field_2;
  (this->super_argParserAdvancedConfiguration).applicationName._M_string_length = 0;
  (this->super_argParserAdvancedConfiguration).applicationName.field_2._M_local_buf[0] = '\0';
  (this->super_argParserAdvancedConfiguration).SIXTYSPACES._M_dataplus._M_p =
       (pointer)&(this->super_argParserAdvancedConfiguration).SIXTYSPACES.field_2;
  local_50[0] = (section *)0x3b;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)&(this->super_argParserAdvancedConfiguration).SIXTYSPACES,
                              (ulong)local_50);
  (this->super_argParserAdvancedConfiguration).SIXTYSPACES._M_dataplus._M_p = pcVar2;
  (this->super_argParserAdvancedConfiguration).SIXTYSPACES.field_2._M_allocated_capacity =
       (size_type)local_50[0];
  builtin_strncpy(pcVar2,"                                                           ",0x3b);
  (this->super_argParserAdvancedConfiguration).SIXTYSPACES._M_string_length = (size_type)local_50[0]
  ;
  (this->super_argParserAdvancedConfiguration).SIXTYSPACES._M_dataplus._M_p
  [(long)&(local_50[0]->sectionName)._M_dataplus] = '\0';
  (this->super_argParserAdvancedConfiguration).lastFailedArg._M_dataplus._M_p =
       (pointer)&(this->super_argParserAdvancedConfiguration).lastFailedArg.field_2;
  (this->super_argParserAdvancedConfiguration).lastFailedArg._M_string_length = 0;
  (this->super_argParserAdvancedConfiguration).lastFailedArg.field_2._M_local_buf[0] = '\0';
  (this->super_argParserAdvancedConfiguration).errorMessage._M_dataplus._M_p =
       (pointer)&(this->super_argParserAdvancedConfiguration).errorMessage.field_2;
  (this->super_argParserAdvancedConfiguration).errorMessage._M_string_length = 0;
  (this->super_argParserAdvancedConfiguration).errorMessage.field_2._M_local_buf[0] = '\0';
  (this->commentToken)._M_dataplus._M_p = (pointer)&(this->commentToken).field_2;
  (this->commentToken)._M_string_length = 0;
  (this->commentToken).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  this->analyseArgvNotJetRun = true;
  (this->nameOfDefaultConfigFile)._M_dataplus._M_p =
       (pointer)&(this->nameOfDefaultConfigFile).field_2;
  (this->nameOfDefaultConfigFile)._M_string_length = 0;
  (this->nameOfDefaultConfigFile).field_2._M_local_buf[0] = '\0';
  (this->defaultConfigFilesLocations)._M_dataplus._M_p =
       (pointer)&(this->defaultConfigFilesLocations).field_2;
  (this->defaultConfigFilesLocations)._M_string_length = 0;
  (this->defaultConfigFilesLocations).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_argParserAdvancedConfiguration).applicationName);
  pcVar1 = (description_->_M_dataplus)._M_p;
  local_50[0] = (section *)(local_50 + 2);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + description_->_M_string_length);
  std::__cxx11::string::append((char *)local_50);
  std::__cxx11::string::operator=((string *)&this->description,(string *)local_50);
  if (local_50[0] != (section *)(local_50 + 2)) {
    operator_delete(local_50[0]);
  }
  this->addHelp = addDefaultHelpCommand_;
  std::__cxx11::string::_M_assign((string *)&this->commentToken);
  this_00 = (vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
             *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  (this->super_argParserAdvancedConfiguration).newargconfig =
       (vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
        *)this_00;
  psVar3 = (section *)operator_new(0x28);
  (psVar3->sectionName).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(psVar3->sectionName).field_2 + 8) = 0;
  psVar3->arguments =
       (vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
        *)0x0;
  (psVar3->sectionName)._M_dataplus._M_p = (pointer)&(psVar3->sectionName).field_2;
  (psVar3->sectionName)._M_string_length = 0;
  pvVar4 = (vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
            *)operator_new(0x18);
  (pvVar4->
  super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar4->
  super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar4->
  super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar3->arguments = pvVar4;
  local_50[0] = psVar3;
  std::
  vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
  ::_M_realloc_insert<argParserAdvancedConfiguration::section*>(this_00,(iterator)0x0,local_50);
  return;
}

Assistant:

argvParser::argvParser(string applicationNam_, string description_, bool addDefaultHelpCommand_, string commentToken_) {
    applicationName = applicationNam_;
    description = description_ + "\n";
    addHelp = addDefaultHelpCommand_;
    commentToken = commentToken_;
    newargconfig = new vector<section*>();
    newargconfig->push_back(new section());
}